

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcursor.cpp
# Opt level: O0

void __thiscall QCursor::QCursor(QCursor *this,QPixmap *pixmap,int hotX,int hotY)

{
  bool bVar1;
  QFlagsStorage<Qt::ImageConversionFlag> flags;
  QFlagsStorage<Qt::ImageConversionFlag> QVar2;
  QCursorData *pQVar3;
  undefined4 in_ECX;
  undefined4 in_EDX;
  qreal in_RSI;
  QPixmap *in_RDI;
  long in_FS_OFFSET;
  QImage mimg;
  QBitmap nullBm;
  QBitmap bmm;
  QBitmap bm;
  QImage img;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  QImage *in_stack_fffffffffffffe90;
  QImage *this_00;
  QImage *in_stack_fffffffffffffe98;
  GlobalColor color;
  undefined7 in_stack_fffffffffffffea0;
  byte in_stack_fffffffffffffea7;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  QPixmap *pQVar4;
  QSize in_stack_fffffffffffffed8;
  QBitmap *in_stack_fffffffffffffee0;
  undefined1 local_78 [16];
  QImageData *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->super_QPaintDevice)._vptr_QPaintDevice = (_func_int **)0x0;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = in_RDI;
  QPixmap::toImage((QPixmap *)in_stack_fffffffffffffe98);
  flags.i = (Int)Qt::operator|((enum_type)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                               (enum_type)in_stack_fffffffffffffe90);
  QImage::convertToFormat
            ((QImage *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
             (Format)((ulong)in_stack_fffffffffffffe98 >> 0x20),(ImageConversionFlags)flags.i);
  QImage::~QImage(in_stack_fffffffffffffe90);
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QVar2.i = (Int)Qt::operator|((enum_type)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                               (enum_type)in_stack_fffffffffffffe90);
  QBitmap::fromImage(in_stack_fffffffffffffe98,
                     (QFlagsStorageHelper<Qt::ImageConversionFlag,_4>)SUB84((ulong)in_RSI >> 0x20,0)
                    );
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  QPixmap::mask((QPixmap *)in_stack_fffffffffffffe98);
  bVar1 = QPixmap::isNull((QPixmap *)in_stack_fffffffffffffe90);
  if (bVar1) {
    QPixmap::mask((QPixmap *)in_stack_fffffffffffffe98);
    bVar1 = QPixmap::isNull((QPixmap *)in_stack_fffffffffffffe90);
    in_stack_fffffffffffffea7 = bVar1 ^ 0xff;
    QBitmap::~QBitmap((QBitmap *)0x341988);
    if ((in_stack_fffffffffffffea7 & 1) == 0) {
      in_stack_fffffffffffffed8 =
           QPixmap::size((QPixmap *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
      color = (GlobalColor)((ulong)in_stack_fffffffffffffe98 >> 0x20);
      QBitmap::QBitmap((QBitmap *)in_stack_fffffffffffffe90,
                       (QSize *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      QBitmap::operator=((QBitmap *)in_stack_fffffffffffffe90,
                         (QBitmap *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      QBitmap::~QBitmap((QBitmap *)0x341ac5);
      QColor::QColor((QColor *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),color);
      QPixmap::fill((QPixmap *)CONCAT44(flags.i,QVar2.i),
                    (QColor *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    }
    else {
      QPixmap::mask((QPixmap *)in_stack_fffffffffffffe98);
      QPixmap::toImage((QPixmap *)in_stack_fffffffffffffe98);
      Qt::operator|((enum_type)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                    (enum_type)in_stack_fffffffffffffe90);
      QImage::convertToFormat
                ((QImage *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                 (Format)((ulong)in_stack_fffffffffffffe98 >> 0x20),(ImageConversionFlags)flags.i);
      QImage::~QImage(in_stack_fffffffffffffe90);
      QBitmap::~QBitmap((QBitmap *)0x341a34);
      Qt::operator|((enum_type)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                    (enum_type)in_stack_fffffffffffffe90);
      QBitmap::fromImage(in_stack_fffffffffffffe98,
                         (QFlagsStorageHelper<Qt::ImageConversionFlag,_4>)
                         SUB84((ulong)in_RSI >> 0x20,0));
      QBitmap::operator=((QBitmap *)in_stack_fffffffffffffe90,
                         (QBitmap *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      QBitmap::~QBitmap((QBitmap *)0x341a79);
      QImage::~QImage(in_stack_fffffffffffffe90);
    }
  }
  else {
    QBitmap::QBitmap((QBitmap *)in_stack_fffffffffffffe90);
    QPixmap::setMask((QPixmap *)in_stack_fffffffffffffe98,(QBitmap *)in_stack_fffffffffffffe90);
    QBitmap::~QBitmap((QBitmap *)0x341951);
  }
  QPixmap::devicePixelRatio((QPixmap *)CONCAT44(in_ECX,in_EDX));
  this_00 = (QImage *)local_78;
  pQVar3 = QCursorData::setBitmap
                     (in_stack_fffffffffffffee0,(QBitmap *)in_stack_fffffffffffffed8,
                      (int)((ulong)pQVar4 >> 0x20),(int)pQVar4,in_RSI);
  (in_RDI->super_QPaintDevice)._vptr_QPaintDevice = (_func_int **)pQVar3;
  QPixmap::operator=(in_RDI,(QPixmap *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0)
                    );
  QBitmap::~QBitmap((QBitmap *)0x341b53);
  QBitmap::~QBitmap((QBitmap *)0x341b5d);
  QImage::~QImage(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QCursor::QCursor(const QPixmap &pixmap, int hotX, int hotY)
    : d(nullptr)
{
    QImage img = pixmap.toImage().convertToFormat(QImage::Format_Indexed8, Qt::ThresholdDither|Qt::AvoidDither);
    QBitmap bm = QBitmap::fromImage(img, Qt::ThresholdDither|Qt::AvoidDither);
    QBitmap bmm = pixmap.mask();
    if (!bmm.isNull()) {
        QBitmap nullBm;
        bm.setMask(nullBm);
    }
    else if (!pixmap.mask().isNull()) {
        QImage mimg = pixmap.mask().toImage().convertToFormat(QImage::Format_Indexed8, Qt::ThresholdDither|Qt::AvoidDither);
        bmm = QBitmap::fromImage(mimg, Qt::ThresholdDither|Qt::AvoidDither);
    }
    else {
        bmm = QBitmap(bm.size());
        bmm.fill(Qt::color1);
    }

    d = QCursorData::setBitmap(bm, bmm, hotX, hotY, pixmap.devicePixelRatio());
    d->pixmap = pixmap;
}